

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall Chainstate::TryAddBlockIndexCandidate(Chainstate *this,CBlockIndex *pindex)

{
  long lVar1;
  CBlockIndex *pCVar2;
  ChainstateManager *pCVar3;
  CBlockIndex **ppCVar4;
  CBlockIndex *in_RSI;
  ChainstateManager *in_RDI;
  long in_FS_OFFSET;
  CBlockIndex *snapshot_base;
  bool is_active_chainstate;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  CBlockIndex *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar5;
  char *in_stack_ffffffffffffffa8;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  int line;
  CBlockIndex **in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_RDI,(char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
             (AnnotatedMixin<std::recursive_mutex> *)0x149be49);
  line = (int)((ulong)pCVar3 >> 0x20);
  pCVar2 = CChain::Tip((CChain *)in_RDI);
  uVar5 = false;
  if (pCVar2 != (CBlockIndex *)0x0) {
    std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
    value_comp((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    in_stack_ffffffffffffff90 = in_RSI;
    CChain::Tip((CChain *)in_RDI);
    uVar5 = ::node::CBlockIndexWorkComparator::operator()
                      ((CBlockIndexWorkComparator *)CONCAT17(uVar5,in_stack_ffffffffffffffa0),
                       (CBlockIndex *)in_RDI,in_stack_ffffffffffffff90);
  }
  if ((bool)uVar5 == false) {
    pCVar3 = (ChainstateManager *)ChainstateManager::ActiveChainstate(in_RDI);
    uVar5 = in_RDI == pCVar3;
    if ((bool)uVar5) {
      std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
      insert((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_> *)
             in_RDI,(value_type *)in_stack_ffffffffffffff90);
    }
    else if (((in_RDI->m_warningcache)._M_elems[0]._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_color & _S_black) == _S_red) {
      pCVar2 = ChainstateManager::GetSnapshotBaseBlock(in_RDI);
      ppCVar4 = inline_assertion_check<true,CBlockIndex_const*>
                          (in_stack_ffffffffffffffc8,(char *)pCVar2,line,
                           (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                            CONCAT16(uVar5,in_stack_ffffffffffffffb0)),
                           in_stack_ffffffffffffffa8);
      pCVar2 = CBlockIndex::GetAncestor
                         ((CBlockIndex *)
                          CONCAT17(in_stack_ffffffffffffffb7,
                                   CONCAT16(uVar5,in_stack_ffffffffffffffb0)),
                          (int)((ulong)*ppCVar4 >> 0x20));
      if (pCVar2 == in_RSI) {
        std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
        insert((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                *)in_RDI,(value_type *)in_stack_ffffffffffffff90);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Chainstate::TryAddBlockIndexCandidate(CBlockIndex* pindex)
{
    AssertLockHeld(cs_main);
    // The block only is a candidate for the most-work-chain if it has the same
    // or more work than our current tip.
    if (m_chain.Tip() != nullptr && setBlockIndexCandidates.value_comp()(pindex, m_chain.Tip())) {
        return;
    }

    bool is_active_chainstate = this == &m_chainman.ActiveChainstate();
    if (is_active_chainstate) {
        // The active chainstate should always add entries that have more
        // work than the tip.
        setBlockIndexCandidates.insert(pindex);
    } else if (!m_disabled) {
        // For the background chainstate, we only consider connecting blocks
        // towards the snapshot base (which can't be nullptr or else we'll
        // never make progress).
        const CBlockIndex* snapshot_base{Assert(m_chainman.GetSnapshotBaseBlock())};
        if (snapshot_base->GetAncestor(pindex->nHeight) == pindex) {
            setBlockIndexCandidates.insert(pindex);
        }
    }
}